

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> * __thiscall
libtorrent::aux::torrent::get_hashes
          (vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           *__return_storage_ptr__,torrent *this,hash_request *req)

{
  if ((((this->super_torrent_hot_members).m_torrent_file.
        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files).
      m_piece_length < 1) {
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    merkle_tree::get_hashes
              (__return_storage_ptr__,
               (this->m_merkle_trees).
               super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
               .
               super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
               ._M_impl.super__Vector_impl_data._M_start + (req->file).m_val,req->base,req->index,
               req->count,req->proof_layers);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sha256_hash> torrent::get_hashes(hash_request const& req) const
	{
		TORRENT_ASSERT(m_torrent_file->is_valid());
		if (!m_torrent_file->is_valid()) return {};
		TORRENT_ASSERT(validate_hash_request(req, m_torrent_file->files()));

		auto const& f = m_merkle_trees[req.file];

		return f.get_hashes(req.base, req.index, req.count, req.proof_layers);
	}